

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternAddressMapper.cpp
# Opt level: O1

void __thiscall
PatternAddressMapper::randomize_addresses
          (PatternAddressMapper *this,FuzzingParameterSet *fuzzing_params,
          vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>
          *agg_access_patterns,bool verbose)

{
  unsigned_long *puVar1;
  pointer pcVar2;
  pointer pAVar3;
  size_t sVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  result_type_conflict1 rVar9;
  AggressorAccessPattern *acc_pattern;
  pointer pAVar10;
  pointer pAVar11;
  size_type sVar12;
  mapped_type *pmVar13;
  _Base_ptr p_Var14;
  string *format;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *psVar15;
  undefined8 uVar16;
  undefined7 in_register_00000009;
  long lVar17;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *psVar18;
  _Base_ptr p_Var19;
  unordered_map<int,_DRAMAddr,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DRAMAddr>_>_>
  *this_00;
  int *w;
  undefined1 auVar20 [8];
  ulong uVar21;
  uint uVar22;
  unsigned_long uVar23;
  bool bVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  initializer_list<int> __l;
  undefined1 local_2850 [8];
  random_device device;
  mt19937 engine;
  discrete_distribution<int> dist;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> occupied_rows;
  undefined1 local_d8 [8];
  vector<int,_std::allocator<int>_> weights;
  vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_> *__range1;
  _Base_ptr local_90;
  size_t row;
  size_type sStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  FuzzingParameterSet *local_68;
  undefined1 local_60 [16];
  undefined1 auStack_50 [32];
  
  this_00 = &this->aggressor_to_addr;
  std::
  _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&this_00->_M_h);
  this->bank_no = bank_counter;
  uVar22 = bank_counter + 0x10;
  if (-1 < (int)(bank_counter + 1U)) {
    uVar22 = bank_counter + 1U;
  }
  bank_counter = (bank_counter - (uVar22 & 0xfffffff0)) + 1;
  auStack_50[0x1f] = FuzzingParameterSet::get_random_use_seq_addresses(fuzzing_params);
  local_68 = fuzzing_params;
  iVar6 = FuzzingParameterSet::get_random_start_row(fuzzing_params);
  if ((int)CONCAT71(in_register_00000009,verbose) != 0) {
    FuzzingParameterSet::print_dynamic_parameters(this->bank_no,(bool)auStack_50[0x1f],iVar6);
  }
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&occupied_rows;
  occupied_rows._M_t._M_impl._0_4_ = 0;
  uVar23 = 0;
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  pAVar10 = (agg_access_patterns->
            super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pAVar3 = (agg_access_patterns->
           super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pAVar10 != pAVar3) {
    uVar23 = 0;
    do {
      uVar23 = uVar23 + ((long)(pAVar10->aggressors).
                               super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)(pAVar10->aggressors).
                               super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
                               super__Vector_impl_data._M_start >> 2);
      pAVar10 = pAVar10 + 1;
    } while (pAVar10 != pAVar3);
  }
  puVar1 = engine._M_x + 1;
  device.field_0._M_mt._M_p = (size_t)puVar1;
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&device.field_0 + 0x1380),
             "[PatternAddressMapper] Target no. of DRAM rows = %d","");
  iVar7 = FuzzingParameterSet::get_num_aggressors(local_68);
  format_string<int>((string *)local_2850,(string *)((long)&device.field_0 + 0x1380),iVar7);
  Logger::log_info((string *)local_2850,true);
  pcVar2 = (pointer)((long)&device.field_0 + 8);
  if (local_2850 != (undefined1  [8])pcVar2) {
    operator_delete((void *)local_2850,device.field_0._M_mt._M_x[1] + 1);
  }
  if ((unsigned_long *)device.field_0._M_mt._M_p != puVar1) {
    operator_delete((void *)device.field_0._M_mt._M_p,engine._M_x[1] + 1);
  }
  device.field_0._M_mt._M_p = (size_t)puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&device.field_0 + 0x1380),
             "[PatternAddressMapper] Aggressors in AggressorAccessPattern = %d","");
  format_string<unsigned_long>
            ((string *)local_2850,(string *)((long)&device.field_0 + 0x1380),uVar23);
  Logger::log_info((string *)local_2850,true);
  if (local_2850 != (undefined1  [8])pcVar2) {
    operator_delete((void *)local_2850,device.field_0._M_mt._M_x[1] + 1);
  }
  if ((unsigned_long *)device.field_0._M_mt._M_p != puVar1) {
    operator_delete((void *)device.field_0._M_mt._M_p,engine._M_x[1] + 1);
  }
  iVar7 = FuzzingParameterSet::get_num_aggressors(local_68);
  device.field_0._M_mt._M_p = (size_t)puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&device.field_0 + 0x1380),
             "[PatternAddressMapper] Probability to map multiple AAPs to same DRAM row = %d","");
  auVar27._8_4_ = (int)(uVar23 >> 0x20);
  auVar27._0_8_ = uVar23;
  auVar27._12_4_ = 0x45300000;
  dVar25 = (double)iVar7 /
           ((auVar27._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar23) - 4503599627370496.0));
  dVar26 = 1.0;
  if (dVar25 <= 1.0) {
    dVar26 = dVar25;
  }
  uVar22 = 100 - (int)(dVar26 * 100.0);
  format = (string *)(ulong)uVar22;
  format_string<int>((string *)local_2850,(string *)((long)&device.field_0 + 0x1380),uVar22);
  Logger::log_info((string *)local_2850,true);
  if (local_2850 != (undefined1  [8])pcVar2) {
    operator_delete((void *)local_2850,device.field_0._M_mt._M_x[1] + 1);
  }
  if ((unsigned_long *)device.field_0._M_mt._M_p != puVar1) {
    operator_delete((void *)device.field_0._M_mt._M_p,engine._M_x[1] + 1);
  }
  std::random_device::random_device((random_device *)local_2850);
  uVar8 = std::random_device::_M_getval();
  p_Var19 = (_Base_ptr)(long)iVar6;
  device.field_0._M_mt._M_p = (size_t)uVar8;
  lVar17 = 1;
  uVar21 = device.field_0._M_mt._M_p;
  do {
    uVar21 = (ulong)(((uint)(uVar21 >> 0x1e) ^ (uint)uVar21) * 0x6c078965 + (int)lVar17);
    engine._M_x[lVar17 + -1] = uVar21;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 0x270);
  engine._M_x[0x26f] = 0x270;
  __l._M_len = 2;
  __l._M_array = (iterator)&engine._M_p;
  engine._M_p._0_4_ = (int)(dVar26 * 100.0);
  engine._M_p._4_4_ = uVar22;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_d8,__l,(allocator_type *)local_60);
  std::discrete_distribution<int>::param_type::
  param_type<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((param_type *)&engine._M_p,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_d8,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             weights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start);
  local_60._0_8_ = auStack_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_60,"[PatternAddressMapper] weights =","");
  Logger::log_info((string *)local_60,true);
  if ((_Base_ptr)local_60._0_8_ != (_Base_ptr)auStack_50) {
    operator_delete((void *)local_60._0_8_,auStack_50._0_8_ + 1);
  }
  if (local_d8 !=
      (undefined1  [8])
      weights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
     ) {
    format = (string *)&row;
    auVar20 = local_d8;
    do {
      row = (size_t)&local_78;
      std::__cxx11::string::_M_construct<char_const*>((string *)format,"%d","");
      format_string<int>((string *)local_60,format,*(int *)auVar20);
      Logger::log_data((string *)local_60,true);
      if ((_Base_ptr)local_60._0_8_ != (_Base_ptr)auStack_50) {
        operator_delete((void *)local_60._0_8_,auStack_50._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)row != &local_78) {
        operator_delete((void *)row,(ulong)(local_78._M_allocated_capacity + 1));
      }
      auVar20 = (undefined1  [8])((long)auVar20 + 4);
    } while (auVar20 !=
             (undefined1  [8])
             weights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start);
  }
  pAVar10 = (agg_access_patterns->
            super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>).
            _M_impl.super__Vector_impl_data._M_start;
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)(agg_access_patterns->
               super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>).
               _M_impl.super__Vector_impl_data._M_finish;
  if (pAVar10 != (pointer)occupied_rows._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    do {
      pAVar11 = (pAVar10->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((pAVar10->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
          super__Vector_impl_data._M_finish != pAVar11) {
        uVar21 = 0;
        weights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)pAVar10;
        do {
          pAVar11 = pAVar11 + uVar21;
          sVar12 = std::
                   _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count(&this_00->_M_h,&pAVar11->id);
          if (sVar12 == 0) {
            if (uVar21 == 0) {
              uVar22 = FuzzingParameterSet::get_agg_inter_distance(local_68);
              format = (string *)(ulong)uVar22;
              iVar6 = FuzzingParameterSet::get_max_row_no(local_68);
              p_Var19 = (_Base_ptr)
                        ((ulong)((long)&p_Var19->_M_color + (long)(int)uVar22) % (ulong)(long)iVar6)
              ;
              rVar9 = std::discrete_distribution<int>::operator()
                                ((discrete_distribution<int> *)&engine._M_p,
                                 (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                                  *)((long)&device.field_0 + 0x1380),(param_type *)&engine._M_p);
              if ((rVar9 == 0) ||
                 (occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_right ==
                  (_Base_ptr)0x0)) {
                iVar6 = 0;
                do {
                  p_Var14 = p_Var19;
                  if (auStack_50[0x1f] != '\0') goto LAB_0013c93e;
                  iVar7 = FuzzingParameterSet::get_max_row_no(local_68);
                  local_60._8_8_ = (long)&p_Var19->_M_color + (long)iVar7;
                  auStack_50._0_8_ = 1;
                  local_60._0_8_ = p_Var19;
                  auStack_50._8_8_ = p_Var19;
                  auStack_50._16_8_ = local_60._8_8_;
                  format = (string *)
                           Range<unsigned_long>::get_random_number
                                     ((Range<unsigned_long> *)local_60,&this->gen);
                  iVar7 = FuzzingParameterSet::get_max_row_no(local_68);
                  local_90 = (_Base_ptr)((ulong)format % (ulong)(long)iVar7);
                  p_Var14 = local_90;
                  if (auStack_50[0x1f] != '\0') goto LAB_0013c93e;
                  psVar15 = &occupied_rows;
                  for (psVar18 = (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                  *)occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._0_8_
                      ; psVar18 !=
                        (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)0x0; psVar18 = (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                           *)(&(psVar18->_M_t)._M_impl.super__Rb_tree_header.
                                               _M_header._M_parent)[bVar24]) {
                    bVar24 = (psVar18->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right <
                             local_90;
                    if (!bVar24) {
                      psVar15 = psVar18;
                    }
                  }
                  psVar18 = &occupied_rows;
                  if ((psVar15 != &occupied_rows) &&
                     (psVar18 = psVar15,
                     local_90 < (psVar15->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right)) {
                    psVar18 = &occupied_rows;
                  }
                  if (psVar18 == &occupied_rows) goto LAB_0013c93e;
                  iVar6 = iVar6 + 1;
                } while (iVar6 != 7);
                row = (size_t)&local_78;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&row,
                           "Assigning unique addresses for Aggressor ID %d didn\'t succeed. Giving up after 3 trials."
                           ,"");
                format = (string *)local_60;
                format_string<int>(format,(string *)&row,pAVar11->id);
                Logger::log_info(format,true);
                if ((_Base_ptr)local_60._0_8_ != (_Base_ptr)auStack_50) {
                  operator_delete((void *)local_60._0_8_,auStack_50._0_8_ + 1);
                }
                p_Var14 = local_90;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)row != &local_78) {
                  operator_delete((void *)row,(ulong)(local_78._M_allocated_capacity + 1));
                  p_Var14 = local_90;
                }
              }
              else {
                local_60._0_8_ = &DAT_00000001;
                local_60._8_8_ = occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                ;
                auStack_50._0_8_ = 1;
                auStack_50._8_8_ = &DAT_00000001;
                auStack_50._16_8_ =
                     occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
                uVar23 = Range<unsigned_long>::get_random_number
                                   ((Range<unsigned_long> *)local_60,&this->gen);
                p_Var14 = occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                while (uVar23 = uVar23 - 1, uVar23 != 0) {
                  p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
                }
                format = (string *)0x0;
                p_Var14 = *(_Base_ptr *)(p_Var14 + 1);
              }
            }
            else {
              if ((ulong)(*(long *)(weights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage + 8) -
                          *(long *)(weights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage + 6) >> 2) <=
                  uVar21 - 1) {
                uVar16 = std::__throw_out_of_range_fmt
                                   (
                                   "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                   );
                if ((_Base_ptr)local_60._0_8_ != (_Base_ptr)auStack_50) {
                  operator_delete((void *)local_60._0_8_,auStack_50._0_8_ + 1);
                }
                if ((string *)row != format) {
                  operator_delete((void *)row,(ulong)(local_78._M_allocated_capacity + 1));
                }
                std::discrete_distribution<int>::~discrete_distribution
                          ((discrete_distribution<int> *)&engine._M_p);
                if (local_d8 != (undefined1  [8])0x0) {
                  operator_delete((void *)local_d8,
                                  (long)weights.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish - (long)local_d8);
                }
                std::random_device::_M_fini();
                std::
                _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)&dist._M_param._M_cp.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
                _Unwind_Resume(uVar16);
              }
              pmVar13 = std::__detail::
                        _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::at((_Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this_00,
                             (key_type *)
                             (*(long *)(weights.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage + 6) +
                             (uVar21 - 1) * 4));
              sVar4 = pmVar13->row;
              uVar22 = FuzzingParameterSet::get_agg_intra_distance(local_68);
              format = (string *)(ulong)uVar22;
              iVar6 = FuzzingParameterSet::get_max_row_no(local_68);
              p_Var19 = (_Base_ptr)((sVar4 + (long)(int)uVar22) % (ulong)(long)iVar6);
              p_Var14 = p_Var19;
            }
          }
          else {
            pmVar13 = std::__detail::
                      _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::at((_Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,&pAVar11->id);
            p_Var14 = (_Base_ptr)pmVar13->row;
          }
LAB_0013c93e:
          local_90 = p_Var14;
          std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>
                    ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)&dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (unsigned_long *)&local_90);
          DRAMAddr::DRAMAddr((DRAMAddr *)&row,(long)this->bank_no,(size_t)local_90,0);
          local_60._0_4_ = pAVar11->id;
          auStack_50._8_8_ = local_78._M_allocated_capacity;
          local_60._8_8_ = row;
          auStack_50._0_8_ = sStack_80;
          std::
          _Hashtable<int,std::pair<int_const,DRAMAddr>,std::allocator<std::pair<int_const,DRAMAddr>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<int,DRAMAddr>>
                    ((_Hashtable<int,std::pair<int_const,DRAMAddr>,std::allocator<std::pair<int_const,DRAMAddr>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)this_00,local_60);
          uVar21 = uVar21 + 1;
          pAVar11 = *(pointer *)
                     (weights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 6);
          pAVar10 = (pointer)weights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        } while (uVar21 < (ulong)(*(long *)(weights.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage + 8) -
                                  (long)pAVar11 >> 2));
      }
      pAVar10 = pAVar10 + 1;
    } while (pAVar10 != (pointer)occupied_rows._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  determine_victims(this,agg_access_patterns);
  this->min_row =
       *(size_t *)(occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + 1);
  lVar17 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&occupied_rows);
  this->max_row = *(size_t *)(lVar17 + 0x20);
  if (verbose) {
    row = (size_t)&local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&row,"Found %d different aggressors (IDs) in pattern.","");
    format_string<unsigned_long>
              ((string *)local_60,(string *)&row,(this->aggressor_to_addr)._M_h._M_element_count);
    Logger::log_info((string *)local_60,true);
    if ((_Base_ptr)local_60._0_8_ != (_Base_ptr)auStack_50) {
      operator_delete((void *)local_60._0_8_,auStack_50._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)row != &local_78) {
      operator_delete((void *)row,(ulong)(local_78._M_allocated_capacity + 1));
    }
  }
  if (dist._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(dist._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                    (long)dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)dist._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  pvVar5 = (void *)CONCAT44(engine._M_p._4_4_,(int)engine._M_p);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,(long)dist._M_param._M_prob.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pvVar5);
  }
  if (local_d8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_d8,
                    (long)weights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_d8);
  }
  std::random_device::_M_fini();
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               *)&dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void PatternAddressMapper::randomize_addresses(FuzzingParameterSet &fuzzing_params,
                                               const std::vector<AggressorAccessPattern> &agg_access_patterns,
                                               bool verbose) {
  // clear any already existing mapping
  aggressor_to_addr.clear();

  // retrieve and then store randomized values as they should be the same for all added addresses
  // (store bank_no as field for get_random_nonaccessed_rows)
  bank_no = PatternAddressMapper::bank_counter;
  PatternAddressMapper::bank_counter = (PatternAddressMapper::bank_counter + 1) % NUM_BANKS;
  const bool use_seq_addresses = fuzzing_params.get_random_use_seq_addresses();
  const int start_row = fuzzing_params.get_random_start_row();
  if (verbose) FuzzingParameterSet::print_dynamic_parameters(bank_no, use_seq_addresses, start_row);

  auto cur_row = static_cast<size_t>(start_row);

  // a set of DRAM rows that are already assigned to aggressors
  std::set<size_t> occupied_rows;

  // we can make use here of the fact that each aggressor (identified by its ID) has a fixed N, that means, is
  // either accessed individually (N=1) or in a group of multiple aggressors (N>1; e.g., N=2 for double sided)
  // => if we already know the address of any aggressor in an aggressor access pattern, we already must know
  // addresses for all of them as we must have accessed all of them together before
  size_t row;
  int assignment_trial_cnt = 0;

  size_t total_abstract_aggs = 0;
  for (auto &acc_pattern : agg_access_patterns) total_abstract_aggs += acc_pattern.aggressors.size();
  Logger::log_info(format_string("[PatternAddressMapper] Target no. of DRAM rows = %d",
      fuzzing_params.get_num_aggressors()));
  Logger::log_info(format_string("[PatternAddressMapper] Aggressors in AggressorAccessPattern = %d",
      total_abstract_aggs));

  // probability to map aggressor to same row as another aggressor is already mapped to
  const int prob2 = 100 - (
      static_cast<int>(
          std::min(static_cast<double>(fuzzing_params.get_num_aggressors())/static_cast<double>(total_abstract_aggs),1.0)*100));
  Logger::log_info(format_string("[PatternAddressMapper] Probability to map multiple AAPs to same DRAM row = %d", prob2));

  std::random_device device;
  std::mt19937 engine(device()); // Seed the random number engine
  std::vector<int> weights = std::vector<int>({100-prob2, prob2});
  std::discrete_distribution<> dist(weights.begin(), weights.end()); // Create the distribution

  Logger::log_info("[PatternAddressMapper] weights =");
  for (const auto &w : weights) {
    Logger::log_data(format_string("%d", w));
  }

//  Logger::log_info("Generating 1k random numbers to see how well distribution works ");
//  size_t cnt_0 = 0;
//  size_t cnt_1 = 0;
//  for (size_t i = 0; i < 1000; ++i) {
//    if (dist(engine) == 0)
//      cnt_0++;
//    else
//      cnt_1++;
//  }
//  Logger::log_info(format_string("cnt_0 = %lu", cnt_0));
//  Logger::log_info(format_string("cnt_1 = %lu", cnt_1));

  for (auto &acc_pattern : agg_access_patterns) {
    for (size_t i = 0; i < acc_pattern.aggressors.size(); i++) {
      const Aggressor &current_agg = acc_pattern.aggressors.at(i);

      // aggressor has existing row mapping OR
      if (aggressor_to_addr.count(current_agg.id) > 0) {
        row = aggressor_to_addr.at(current_agg.id).row;
      } else if (i > 0) {  // aggressor is part of a n>1 aggressor tuple
        // we need to add the appropriate distance and cannot choose randomly
        auto last_addr = aggressor_to_addr.at(acc_pattern.aggressors.at(i - 1).id);
        // update cur_row for its next use (note that here it is: cur_row = last_addr.row)
        cur_row = (last_addr.row + (size_t) fuzzing_params.get_agg_intra_distance())%fuzzing_params.get_max_row_no();
        row = cur_row;
      } else {
        // this is a new aggressor pair - we can choose where to place it
        // if use_seq_addresses is true, we use the last address and add the agg_inter_distance on top -> this is the
        //   row of the next aggressor
        // if use_seq_addresses is false, we just pick any random row no. between [0, 8192]
        cur_row = (cur_row + (size_t) fuzzing_params.get_agg_inter_distance())%fuzzing_params.get_max_row_no();

        bool map_to_existing_agg = dist(engine);
        if (map_to_existing_agg && !occupied_rows.empty()) {
            auto idx = Range<size_t>(1, occupied_rows.size()).get_random_number(gen)-1;
            auto it = occupied_rows.begin();
            while (idx--) it++;
            row = *it;
        } else {
        retry:
          row = use_seq_addresses ?
                cur_row :
                (Range<size_t>(cur_row, cur_row + fuzzing_params.get_max_row_no()).get_random_number(gen)
                    %fuzzing_params.get_max_row_no());

          // check that we haven't assigned this address yet to another aggressor ID
          // if use_seq_addresses is True, the only way that the address is already assigned is that we already flipped
          // around the address range once (because of the modulo operator) so that retrying doesn't make sense
          if (!use_seq_addresses && occupied_rows.count(row) > 0) {
            assignment_trial_cnt++;
            if (assignment_trial_cnt < 7) goto retry;
            Logger::log_info(format_string(
                "Assigning unique addresses for Aggressor ID %d didn't succeed. Giving up after 3 trials.",
                current_agg.id));
          }
        }
      }

      assignment_trial_cnt = 0;
      occupied_rows.insert(row);
      aggressor_to_addr.insert(std::make_pair(current_agg.id, DRAMAddr(static_cast<size_t>(bank_no), row, 0)));
    }
  }

  // determine victim rows
  determine_victims(agg_access_patterns);

  // this works as sets are always ordered
  min_row = *occupied_rows.begin();
  max_row = *occupied_rows.rbegin();

  if (verbose)
    Logger::log_info(format_string("Found %d different aggressors (IDs) in pattern.", aggressor_to_addr.size()));
}